

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

vector<Vector2f,_std::allocator<Vector2f>_> *
poly_mul<Vector2f>(vector<Vector2f,_std::allocator<Vector2f>_> *a,double b)

{
  bool bVar1;
  reference this;
  vector<Vector2f,_std::allocator<Vector2f>_> *in_RSI;
  vector<Vector2f,_std::allocator<Vector2f>_> *in_RDI;
  double in_XMM0_Qa;
  Vector2f *x;
  iterator __end0;
  iterator __begin0;
  vector<Vector2f,_std::allocator<Vector2f>_> *__range1;
  vector<Vector2f,_std::allocator<Vector2f>_> *in_stack_ffffffffffffffa8;
  __normal_iterator<Vector2f_*,_std::vector<Vector2f,_std::allocator<Vector2f>_>_> local_28 [2];
  double local_18;
  
  local_18 = in_XMM0_Qa;
  local_28[0]._M_current =
       (Vector2f *)
       std::vector<Vector2f,_std::allocator<Vector2f>_>::begin(in_stack_ffffffffffffffa8);
  std::vector<Vector2f,_std::allocator<Vector2f>_>::end(in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<Vector2f_*,_std::vector<Vector2f,_std::allocator<Vector2f>_>_>
                        *)in_RSI,
                       (__normal_iterator<Vector2f_*,_std::vector<Vector2f,_std::allocator<Vector2f>_>_>
                        *)in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    this = __gnu_cxx::
           __normal_iterator<Vector2f_*,_std::vector<Vector2f,_std::allocator<Vector2f>_>_>::
           operator*(local_28);
    Vector2f::operator*=(this,(float)local_18);
    __gnu_cxx::__normal_iterator<Vector2f_*,_std::vector<Vector2f,_std::allocator<Vector2f>_>_>::
    operator++(local_28);
  }
  std::vector<Vector2f,_std::allocator<Vector2f>_>::vector(in_RSI,in_stack_ffffffffffffffa8);
  return in_RDI;
}

Assistant:

std::vector<T> poly_mul(std::vector<T> a, double b) {
	for (auto& x : a) x *= b;
	return a;
}